

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O2

void __thiscall avro::Exception::~Exception(Exception *this)

{
  ~Exception((Exception *)((long)&this->_vptr_Exception + (long)this->_vptr_Exception[-3]));
  return;
}

Assistant:

class AVRO_DECL Exception : public virtual std::runtime_error
{
  public:

    Exception(const std::string &msg) :
        std::runtime_error(msg)
    { }

    Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }  
}